

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void cleanup_profile(void)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  for (uVar1 = 0; uVar1 < z_info->profile_max; uVar1 = uVar1 + 1) {
    lVar3 = 8;
    for (lVar2 = 0; lVar2 < cave_profiles[uVar1].n_room_profiles; lVar2 = lVar2 + 1) {
      string_free(*(char **)((long)&(cave_profiles[uVar1].room_profiles)->next + lVar3));
      lVar3 = lVar3 + 0x38;
    }
    mem_free(cave_profiles[uVar1].room_profiles);
    string_free(cave_profiles[uVar1].name);
  }
  mem_free(cave_profiles);
  return;
}

Assistant:

static void cleanup_profile(void)
{
	int i, j;
	for (i = 0; i < z_info->profile_max; i++) {
		for (j = 0; j < cave_profiles[i].n_room_profiles; j++)
			string_free((char *) cave_profiles[i].room_profiles[j].name);
		mem_free(cave_profiles[i].room_profiles);
		string_free((char *) cave_profiles[i].name);
	}
	mem_free(cave_profiles);
}